

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_X509.cpp
# Opt level: O1

size_t __thiscall
axl::cry::X509Cert::saveDer(X509Cert *this,Array<char,_axl::sl::ArrayDetails<char>_> *buffer)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  unsigned_long uVar3;
  uchar_t *p;
  EVP_PKEY_CTX *local_10;
  
  local_10 = (EVP_PKEY_CTX *)0x0;
  uVar1 = i2d_X509((X509 *)(this->
                           super_Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>).
                           m_h,(uchar **)&local_10);
  if ((int)uVar1 < 1) {
    uVar3 = failWithLastCryptoError<unsigned_long>(0xffffffffffffffff);
  }
  else {
    iVar2 = sl::Array<char,_axl::sl::ArrayDetails<char>_>::copy
                      (buffer,local_10,(EVP_PKEY_CTX *)(ulong)uVar1);
    uVar3 = CONCAT44(extraout_var,iVar2);
    CRYPTO_free(local_10);
  }
  return uVar3;
}

Assistant:

size_t
X509Cert::saveDer(sl::Array<char>* buffer) const {
	uchar_t* p = NULL;
	int length = i2d_X509(m_h, &p);
	if (length <= 0)
		return failWithLastCryptoError<size_t>(-1);

	size_t result = buffer->copy((char*)p, length);
	OPENSSL_free(p);
	return result;
}